

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
kj::Vector<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry>::setCapacity
          (Vector<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry> *this,size_t newSize)

{
  ArrayDisposer *pAVar1;
  ArrayBuilder<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry> *pAVar2;
  size_t __length;
  size_t extraout_RDX;
  size_t size;
  undefined1 local_38 [8];
  ArrayBuilder<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry> newBuilder;
  size_t newSize_local;
  Vector<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry> *this_local;
  
  newBuilder.disposer = (ArrayDisposer *)newSize;
  pAVar1 = (ArrayDisposer *)
           ArrayBuilder<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry>::size(&this->builder)
  ;
  size = __length;
  if (newBuilder.disposer < pAVar1) {
    ArrayBuilder<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry>::truncate
              (&this->builder,(char *)newBuilder.disposer,__length);
    size = extraout_RDX;
  }
  heapArrayBuilder<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry>
            ((ArrayBuilder<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry> *)local_38,
             (kj *)newBuilder.disposer,size);
  pAVar2 = mv<kj::ArrayBuilder<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry>>
                     (&this->builder);
  ArrayBuilder<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry>::
  addAll<kj::ArrayBuilder<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry>>
            ((ArrayBuilder<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry> *)local_38,pAVar2);
  pAVar2 = mv<kj::ArrayBuilder<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry>>
                     ((ArrayBuilder<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry> *)
                      local_38);
  ArrayBuilder<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry>::operator=
            (&this->builder,pAVar2);
  ArrayBuilder<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry>::~ArrayBuilder
            ((ArrayBuilder<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry> *)local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }